

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O1

void __thiscall QEasingCurve::QEasingCurve(QEasingCurve *this,QEasingCurve *other)

{
  QEasingCurvePrivate *pQVar1;
  int iVar2;
  QEasingCurvePrivate *pQVar3;
  undefined4 extraout_var;
  QEasingCurveFunction *pQVar4;
  
  pQVar3 = (QEasingCurvePrivate *)operator_new(0x18);
  pQVar1 = other->d_ptr;
  pQVar3->type = pQVar1->type;
  if (pQVar1->config == (QEasingCurveFunction *)0x0) {
    pQVar4 = (QEasingCurveFunction *)0x0;
  }
  else {
    iVar2 = (*pQVar1->config->_vptr_QEasingCurveFunction[3])();
    pQVar4 = (QEasingCurveFunction *)CONCAT44(extraout_var,iVar2);
  }
  pQVar3->config = pQVar4;
  pQVar3->func = pQVar1->func;
  this->d_ptr = pQVar3;
  return;
}

Assistant:

QEasingCurve::QEasingCurve(const QEasingCurve &other)
    : d_ptr(new QEasingCurvePrivate(*other.d_ptr))
{
    // ### non-atomic, requires malloc on shallow copy
}